

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<AutoFile,std::byte,std::allocator<std::byte>>
               (AutoFile *os,vector<std::byte,_std::allocator<std::byte>_> *v)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>
            (os,(long)(v->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  pbVar2 = (v->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (v->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    AutoFile::write(os,(int)pbVar2,pbVar3 + -(long)pbVar2,in_RCX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}